

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::AsyncStreamFd::abortRead(AsyncStreamFd *this)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_28;
  Fault f;
  SyscallResult local_14;
  AsyncStreamFd *pAStack_10;
  SyscallResult _kjSyscallResult;
  AsyncStreamFd *this_local;
  
  f.exception = (Exception *)this;
  pAStack_10 = this;
  local_14 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::AsyncStreamFd::abortRead()::_lambda()_1_>
                       ((anon_class_8_1_8991fb9c *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_14);
  if (pvVar1 != (void *)0x0) {
    return;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_14);
  kj::_::Debug::Fault::Fault
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x1f0,osErrorNumber,"shutdown(fd, SHUT_RD)","");
  kj::_::Debug::Fault::fatal(&local_28);
}

Assistant:

void abortRead() override {
    // There's no legitimate way to get an AsyncStreamFd that isn't a socket through the
    // UnixAsyncIoProvider interface.
    KJ_SYSCALL(shutdown(fd, SHUT_RD));
  }